

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  cmTarget *pcVar1;
  string *psVar2;
  char *value;
  string *extraout_RDX;
  char local_2f9;
  string language;
  string fproj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  cmGeneratedFileStream fout;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar2->_M_dataplus)._M_p;
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)psVar2->_M_string_length;
  language._M_string_length = (size_type)&language.field_2;
  language._M_dataplus._M_p = (pointer)0x1;
  language.field_2._M_local_buf[0] = '/';
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
            (&local_2a8,this->LocalGenerator,this->GeneratorTarget);
  local_2f9 = '/';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char_const*>
            (&fproj,(cmAlphaNum *)&fout,(cmAlphaNum *)&language,&local_2a8,&local_2f9,&this->Name,
             &cmGlobalGhsMultiGenerator::FILE_EXTENSION);
  std::__cxx11::string::~string((string *)&local_2a8);
  pcVar1 = this->GeneratorTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"GENERATOR_FILE_NAME",(allocator<char> *)&language);
  cmTarget::SetProperty(pcVar1,(string *)&fout,&fproj);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = this->GeneratorTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"GENERATOR_FILE_NAME_EXT",(allocator<char> *)&language);
  value = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar1,(string *)&fout,value);
  std::__cxx11::string::~string((string *)&fout);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&fproj,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  cmGlobalGhsMultiGenerator::WriteFileHeader
            ((cmGlobalGhsMultiGenerator *)
             (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)&fout);
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)&fout);
  if (this->TagType != CUSTOM_TARGET) {
    psVar2 = &this->ConfigName;
    cmGeneratorTarget::GetLinkerLanguage(&language,this->GeneratorTarget,psVar2);
    WriteTargetSpecifics(this,(ostream *)&fout,psVar2);
    SetCompilerFlags(this,psVar2,&language);
    WriteCompilerFlags(this,(ostream *)&fout,extraout_RDX,&language);
    WriteCompilerDefinitions(this,(ostream *)&fout,psVar2,&language);
    WriteIncludes(this,(ostream *)&fout,psVar2,&language);
    WriteTargetLinkLine(this,(ostream *)&fout,psVar2);
    WriteBuildEvents(this,(ostream *)&fout);
    std::__cxx11::string::~string((string *)&language);
  }
  WriteSources(this,(ostream *)&fout);
  cmGeneratedFileStream::Close(&fout);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&fproj);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj =
    cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             '/', this->Name, cmGlobalGhsMultiGenerator::FILE_EXTENSION);

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME", fproj);
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}